

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O3

void Omega_h::vtk::write_vtu(ostream *stream,Mesh *mesh,Int cell_dim,TagSet *tags,bool compress)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int *piVar3;
  _Rb_tree_header *p_Var4;
  pointer psVar5;
  _Rb_tree_node_base *name;
  ulong uVar6;
  Mesh *pMVar7;
  TagSet *pTVar8;
  bool bVar9;
  int iVar10;
  LO LVar11;
  Int IVar12;
  I32 IVar13;
  long *plVar14;
  undefined8 *puVar15;
  _Rb_tree_node_base *p_Var16;
  ostream *poVar17;
  const_iterator cVar18;
  Tag<long> *pTVar19;
  TagBase *pTVar20;
  string *psVar21;
  uint uVar22;
  Alloc *pAVar23;
  byte value;
  uint uVar24;
  char *pcVar25;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar26;
  undefined8 uVar27;
  pointer psVar28;
  char *format;
  undefined7 in_register_00000081;
  int iVar29;
  ulong uVar30;
  ScopedTimer omega_h_scoped_function_timer;
  Read<signed_char> types;
  string __str;
  Reals coords;
  LOs ends;
  Bytes ghost_types;
  undefined1 local_130 [24];
  undefined5 uStack_118;
  undefined3 uStack_113;
  uint local_10c;
  ostream *local_108;
  ScopedTimer local_f9;
  ulong local_f8;
  Mesh *local_f0;
  undefined1 local_e8 [32];
  TagSet *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [32];
  Read<signed_char> local_80;
  Alloc *local_70;
  Reals local_60;
  Read<int> local_50;
  Read<double> local_40;
  
  local_108 = stream;
  local_f0 = mesh;
  local_80.write_.shared_alloc_.alloc = (Alloc *)&local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,"");
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_e8._0_8_ = local_e8 + 0x10;
  pAVar23 = (Alloc *)(plVar14 + 2);
  if ((Alloc *)*plVar14 == pAVar23) {
    local_e8._16_8_ = pAVar23->size;
    local_e8._24_8_ = plVar14[3];
  }
  else {
    local_e8._16_8_ = pAVar23->size;
    local_e8._0_8_ = (Alloc *)*plVar14;
  }
  local_e8._8_8_ = plVar14[1];
  *plVar14 = (long)pAVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  local_c0._M_allocated_capacity = (size_type)(Alloc *)local_b0;
  std::__cxx11::string::_M_construct((ulong)&local_c0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0._M_allocated_capacity,3,0x25c);
  psVar5 = (pointer)((long)(Library **)local_e8._8_8_ + local_c0._8_8_);
  psVar28 = (pointer)0xf;
  if ((Alloc *)local_e8._0_8_ != (Alloc *)(local_e8 + 0x10)) {
    psVar28 = (pointer)local_e8._16_8_;
  }
  if (psVar28 < psVar5) {
    psVar28 = (pointer)0xf;
    if ((Alloc *)local_c0._M_allocated_capacity != (Alloc *)local_b0) {
      psVar28 = (pointer)local_b0._0_8_;
    }
    if (psVar28 < psVar5) goto LAB_00417d24;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,local_e8._0_8_);
  }
  else {
LAB_00417d24:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_e8,local_c0._M_allocated_capacity)
    ;
  }
  local_130._0_8_ = local_130 + 0x10;
  puVar1 = puVar15 + 2;
  if ((ulong *)*puVar15 == puVar1) {
    local_130._16_8_ = *puVar1;
    _uStack_118 = puVar15[3];
  }
  else {
    local_130._16_8_ = *puVar1;
    local_130._0_8_ = (ulong *)*puVar15;
  }
  local_130._8_8_ = puVar15[1];
  *puVar15 = puVar1;
  puVar15[1] = 0;
  *(char *)puVar1 = '\0';
  begin_code("write_vtu",(char *)local_130._0_8_);
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  if ((Alloc *)local_c0._M_allocated_capacity != (Alloc *)local_b0) {
    operator_delete((void *)local_c0._M_allocated_capacity,
                    (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_b0._0_8_)->_M_ptr + 1));
  }
  if ((Alloc *)local_e8._0_8_ != (Alloc *)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (local_80.write_.shared_alloc_.alloc != (Alloc *)&local_70) {
    operator_delete(local_80.write_.shared_alloc_.alloc,(ulong)((long)&local_70->size + 1));
  }
  local_10c = (uint)CONCAT71(in_register_00000081,compress);
  local_c8 = tags;
  if ((cell_dim == -1) && (cell_dim = local_f0->dim_, 3 < (uint)cell_dim)) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  local_f8 = (ulong)(uint)cell_dim;
  uVar30 = 0;
  do {
    iVar29 = (int)uVar30;
    if (uVar30 == 0 || uVar30 == local_f8) {
      psVar26 = local_c8->_M_elems;
      for (p_Var16 = local_c8->_M_elems[uVar30]._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var16 != &psVar26[uVar30]._M_t._M_impl.super__Rb_tree_header;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        name = p_Var16 + 1;
        bVar9 = Omega_h::Mesh::has_tag(local_f0,iVar29,(string *)name);
        if ((((!bVar9) && (iVar10 = std::__cxx11::string::compare((char *)name), iVar10 != 0)) &&
            (iVar10 = std::__cxx11::string::compare((char *)name), iVar10 != 0)) &&
           (iVar10 = std::__cxx11::string::compare((char *)name), iVar10 != 0)) {
          uVar27 = *(undefined8 *)name;
          format = 
          "User requested VTK output of tag %s on %s, but that tag doesn\'t exist on the mesh!";
          if (iVar29 == 1) goto LAB_00418d4e;
          if (iVar29 == 2) goto LAB_00418d57;
          if (iVar29 == 3) goto LAB_00418d45;
          goto LAB_00418d89;
        }
      }
    }
    else if (local_c8->_M_elems[uVar30]._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if (iVar29 - 1U < 3) {
        uVar27 = (&DAT_004ba658)[iVar29 - 1U];
      }
      else {
        uVar27 = 0;
      }
      format = "User requested VTK output of tags on %s, but only vertices and %s are output!";
      if (local_f8 == 1) {
LAB_00418d4e:
        pcVar25 = "edges";
      }
      else if ((int)local_f8 == 2) {
LAB_00418d57:
        pcVar25 = "faces";
      }
      else {
        uVar30 = local_f8;
        if ((int)local_f8 == 3) {
LAB_00418d45:
          pcVar25 = "regions";
        }
        else {
LAB_00418d89:
          pcVar25 = (char *)0x0;
          if (uVar30 == 0) {
            pcVar25 = "vertices";
          }
        }
      }
      fail(format,uVar27,pcVar25);
    }
    uVar6 = local_f8;
    uVar30 = uVar30 + 1;
  } while (uVar30 != 4);
  bVar9 = local_10c._0_1_;
  local_10c = local_10c & 0xff;
  write_vtkfile_vtu_start_tag(local_108,bVar9);
  pMVar7 = local_f0;
  std::__ostream_insert<char,std::char_traits<char>>(local_108,"<UnstructuredGrid>\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(local_108,"<Piece NumberOfPoints=\"",0x17);
  LVar11 = Omega_h::Mesh::nverts(pMVar7);
  poVar17 = (ostream *)std::ostream::operator<<((ostream *)local_108,LVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_108," NumberOfCells=\"",0x10);
  IVar12 = (Int)uVar6;
  LVar11 = Omega_h::Mesh::nents(pMVar7,IVar12);
  poVar17 = (ostream *)std::ostream::operator<<((ostream *)local_108,LVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\">\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(local_108,"<Cells>\n",8);
  LVar11 = Omega_h::Mesh::nents(pMVar7,IVar12);
  uVar22 = IVar12 - 1;
  if (pMVar7->family_ == OMEGA_H_SIMPLEX) {
    if (2 < uVar22) goto LAB_00417fef;
    uVar24 = 0xa0503;
  }
  else {
    if (2 < uVar22) {
LAB_00417fef:
      value = -(uVar6 != 0) | 1;
      goto LAB_00417ff9;
    }
    uVar24 = 0xc0903;
  }
  value = (byte)(uVar24 >> ((char)uVar22 * '\b' & 0x1fU));
LAB_00417ff9:
  local_130._8_8_ = 0;
  local_130._16_8_ = local_130._16_8_ & 0xffffffffffffff00;
  local_130._0_8_ = local_130 + 0x10;
  Read<signed_char>::Read((Read<signed_char> *)local_e8,LVar11,value,(string *)local_130);
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  uVar30 = local_f8;
  local_130._0_8_ = local_130 + 0x10;
  local_130._16_6_ = 0x7365707974;
  local_130._8_8_ = 5;
  local_80.write_.shared_alloc_.alloc = (Alloc *)local_e8._0_8_;
  if ((local_e8._0_8_ & 7) == 0 && (Alloc *)local_e8._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_e8._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_e8._0_8_ + 0x30) = *(int *)(local_e8._0_8_ + 0x30) + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = (void *)local_e8._8_8_;
  write_array<signed_char,signed_char>(local_108,(string *)local_130,1,&local_80,SUB41(local_10c,0))
  ;
  pAVar23 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(pAVar23);
      operator_delete(pAVar23,0x48);
    }
  }
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  Omega_h::Mesh::ask_verts_of((Mesh *)&local_c0,(Int)pMVar7);
  uVar22 = (uint)uVar30;
  if (pMVar7->family_ == OMEGA_H_SIMPLEX) {
    iVar29 = -1;
    if (uVar22 < 4) {
      iVar29 = uVar22 + 1;
    }
  }
  else {
    iVar29 = -1;
    if (uVar22 < 4) {
      iVar29 = *(int *)(&DAT_00442ba8 + uVar30 * 4);
    }
  }
  LVar11 = Omega_h::Mesh::nents(pMVar7,uVar22);
  local_130._8_8_ = 0;
  local_130._16_8_ = local_130._16_8_ & 0xffffffffffffff00;
  local_130._0_8_ = local_130 + 0x10;
  Read<int>::Read((Read<int> *)(local_a0 + 0x10),LVar11,iVar29,iVar29,(string *)local_130);
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  local_130._0_8_ = local_130 + 0x10;
  local_130._16_8_ = 0x697463656e6e6f63;
  local_130._8_8_ = 0xc;
  uStack_118 = 0x79746976;
  local_a0._0_8_ = local_c0._M_allocated_capacity;
  if ((local_c0._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_c0._M_allocated_capacity != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0._0_8_ = *(long *)local_c0._M_allocated_capacity * 8 + 1;
    }
    else {
      *(int *)(local_c0._M_allocated_capacity + 0x30) =
           *(int *)(local_c0._M_allocated_capacity + 0x30) + 1;
    }
  }
  local_a0._8_8_ = local_c0._8_8_;
  write_array<int,int>(local_108,(string *)local_130,1,(Read<int> *)local_a0,SUB41(local_10c,0));
  uVar27 = local_a0._0_8_;
  if ((local_a0._0_8_ & 7) == 0 && (Alloc *)local_a0._0_8_ != (Alloc *)0x0) {
    piVar3 = (int *)(local_a0._0_8_ + 0x30);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_a0._0_8_);
      operator_delete((void *)uVar27,0x48);
    }
  }
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  local_130._0_8_ = local_130 + 0x10;
  local_130._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
  local_130._16_8_ = 0x7374657366666f;
  local_50.write_.shared_alloc_.alloc = (Alloc *)local_a0._16_8_;
  if ((local_a0._16_8_ & 7) == 0 && (Alloc *)local_a0._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_a0._16_8_ * 8 + 1);
    }
    else {
      *(int *)(local_a0._16_8_ + 0x30) = *(int *)(local_a0._16_8_ + 0x30) + 1;
    }
  }
  local_50.write_.shared_alloc_.direct_ptr = (void *)local_a0._24_8_;
  write_array<int,int>(local_108,(string *)local_130,1,&local_50,SUB41(local_10c,0));
  pAVar23 = local_50.write_.shared_alloc_.alloc;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_50.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
      operator_delete(pAVar23,0x48);
    }
  }
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  uVar27 = local_a0._16_8_;
  if ((local_a0._16_8_ & 7) == 0 && (Alloc *)local_a0._16_8_ != (Alloc *)0x0) {
    piVar3 = (int *)(local_a0._16_8_ + 0x30);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_a0._16_8_);
      operator_delete((void *)uVar27,0x48);
    }
  }
  uVar27 = local_c0._M_allocated_capacity;
  if ((local_c0._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_c0._M_allocated_capacity != (Alloc *)0x0) {
    piVar3 = (int *)(local_c0._M_allocated_capacity + 0x30);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_c0._M_allocated_capacity);
      operator_delete((void *)uVar27,0x48);
    }
  }
  uVar27 = local_e8._0_8_;
  if ((local_e8._0_8_ & 7) == 0 && (Alloc *)local_e8._0_8_ != (Alloc *)0x0) {
    piVar3 = (int *)(local_e8._0_8_ + 0x30);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_e8._0_8_);
      operator_delete((void *)uVar27,0x48);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_108,"</Cells>\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(local_108,"<Points>\n",9);
  Omega_h::Mesh::coords((Mesh *)local_a0);
  local_130._0_8_ = local_130 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"coordinates","");
  local_60.write_.shared_alloc_.alloc = (Alloc *)local_a0._0_8_;
  if ((local_a0._0_8_ & 7) == 0 && (Alloc *)local_a0._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_a0._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_a0._0_8_ + 0x30) = *(int *)(local_a0._0_8_ + 0x30) + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = (void *)local_a0._8_8_;
  if ((uint)pMVar7->dim_ < 4) {
    resize_vectors((Omega_h *)&local_40,&local_60,pMVar7->dim_,3);
    write_array<double,double>(local_108,(string *)local_130,3,&local_40,SUB41(local_10c,0));
    if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
        local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_40.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
        operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
      }
    }
    pAVar23 = local_60.write_.shared_alloc_.alloc;
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_60.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar23);
        operator_delete(pAVar23,0x48);
      }
    }
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
    poVar17 = local_108;
    std::__ostream_insert<char,std::char_traits<char>>(local_108,"</Points>\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<PointData>\n",0xc);
    local_130._0_8_ = local_130 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"global","");
    pMVar7 = local_f0;
    bVar9 = Omega_h::Mesh::has_tag(local_f0,0,(string *)local_130);
    pTVar8 = local_c8;
    if (bVar9) {
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"global","");
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pTVar8,(key_type *)local_e8);
      bVar9 = (_Rb_tree_header *)cVar18._M_node !=
              &pTVar8->_M_elems[0]._M_t._M_impl.super__Rb_tree_header;
      if ((Alloc *)local_e8._0_8_ != (Alloc *)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
      }
    }
    else {
      bVar9 = false;
    }
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
    if (bVar9) {
      local_130._0_8_ = local_130 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"global","");
      pTVar19 = Omega_h::Mesh::get_tag<long>(pMVar7,0,(string *)local_130);
      if (3 < (uint)pMVar7->dim_) {
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      write_tag(local_108,&pTVar19->super_TagBase,pMVar7->dim_,SUB41(local_10c,0));
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
      }
    }
    iVar29 = 0;
    write_locals_and_owners(local_108,pMVar7,0,local_c8,SUB41(local_10c,0));
    pMVar7 = local_f0;
    psVar26 = local_c8->_M_elems;
    do {
      IVar12 = Omega_h::Mesh::ntags(pMVar7,0);
      poVar17 = local_108;
      if (IVar12 <= iVar29) {
        std::__ostream_insert<char,std::char_traits<char>>(local_108,"</PointData>\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<CellData>\n",0xb);
        local_130._0_8_ = local_130 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"global","");
        pMVar7 = local_f0;
        bVar9 = Omega_h::Mesh::has_tag(local_f0,(Int)local_f8,(string *)local_130);
        pTVar8 = local_c8;
        if (bVar9) {
          local_e8._0_8_ = local_e8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"global","");
          psVar26 = pTVar8->_M_elems + (int)local_f8;
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&psVar26->_M_t,(key_type *)local_e8);
          bVar9 = (_Rb_tree_header *)cVar18._M_node !=
                  &(psVar26->_M_t)._M_impl.super__Rb_tree_header;
          if ((Alloc *)local_e8._0_8_ != (Alloc *)(local_e8 + 0x10)) {
            operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
          }
        }
        else {
          bVar9 = false;
        }
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
        }
        if (bVar9) {
          local_130._0_8_ = local_130 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"global","");
          pTVar19 = Omega_h::Mesh::get_tag<long>(pMVar7,(Int)local_f8,(string *)local_130);
          if (3 < (uint)pMVar7->dim_) {
            fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                 ,0x33);
          }
          write_tag(local_108,&pTVar19->super_TagBase,pMVar7->dim_,SUB41(local_10c,0));
          if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
            operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
          }
        }
        write_locals_and_owners(local_108,pMVar7,(Int)local_f8,pTVar8,SUB41(local_10c,0));
        local_130._0_8_ = local_130 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"vtkGhostType","");
        psVar26 = local_c8->_M_elems + (int)local_f8;
        cVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&psVar26->_M_t,(key_type *)local_130);
        p_Var4 = &(psVar26->_M_t)._M_impl.super__Rb_tree_header;
        if ((Comm *)local_130._0_8_ != (Comm *)(local_130 + 0x10)) {
          operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
        }
        if ((_Rb_tree_header *)cVar18._M_node != p_Var4) {
          Omega_h::Mesh::comm(local_f0);
          IVar13 = Comm::size((Comm *)local_130._0_8_);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
          }
          if (IVar13 != 1) {
            Omega_h::Mesh::owned((Mesh *)local_e8,(Int)local_f0);
            local_c0._M_allocated_capacity = local_e8._0_8_;
            if ((local_e8._0_8_ & 7) == 0 && (Alloc *)local_e8._0_8_ != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_c0._M_allocated_capacity = *(long *)local_e8._0_8_ * 8 + 1;
              }
              else {
                *(int *)(local_e8._0_8_ + 0x30) = *(int *)(local_e8._0_8_ + 0x30) + 1;
              }
            }
            local_c0._8_8_ = local_e8._8_8_;
            each_eq_to<signed_char>((Omega_h *)&local_80,(Read<signed_char> *)&local_c0,'\0');
            uVar27 = local_c0._M_allocated_capacity;
            if ((local_c0._M_allocated_capacity & 7) == 0 &&
                (Alloc *)local_c0._M_allocated_capacity != (Alloc *)0x0) {
              piVar3 = (int *)(local_c0._M_allocated_capacity + 0x30);
              *piVar3 = *piVar3 + -1;
              if (*piVar3 == 0) {
                Alloc::~Alloc((Alloc *)local_c0._M_allocated_capacity);
                operator_delete((void *)uVar27,0x48);
              }
            }
            local_130._0_8_ = local_130 + 0x10;
            local_130._16_8_ = 0x74736f68476b7476;
            local_130._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc;
            uStack_118 = 0x65707954;
            local_a0._16_8_ = local_80.write_.shared_alloc_.alloc;
            if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
                local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              if (entering_parallel == '\x01') {
                local_a0._16_8_ = (local_80.write_.shared_alloc_.alloc)->size * 8 + 1;
              }
              else {
                (local_80.write_.shared_alloc_.alloc)->use_count =
                     (local_80.write_.shared_alloc_.alloc)->use_count + 1;
              }
            }
            local_a0._24_8_ = local_80.write_.shared_alloc_.direct_ptr;
            write_array<signed_char,unsigned_char>
                      (local_108,(string *)local_130,1,(Read<signed_char> *)(local_a0 + 0x10),
                       SUB41(local_10c,0));
            uVar27 = local_a0._16_8_;
            if ((local_a0._16_8_ & 7) == 0 && (Alloc *)local_a0._16_8_ != (Alloc *)0x0) {
              piVar3 = (int *)(local_a0._16_8_ + 0x30);
              *piVar3 = *piVar3 + -1;
              if (*piVar3 == 0) {
                Alloc::~Alloc((Alloc *)uVar27);
                operator_delete((void *)uVar27,0x48);
              }
            }
            if ((Comm *)local_130._0_8_ != (Comm *)(local_130 + 0x10)) {
              operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
            }
            pAVar23 = local_80.write_.shared_alloc_.alloc;
            if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
                local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
              piVar3 = &(local_80.write_.shared_alloc_.alloc)->use_count;
              *piVar3 = *piVar3 + -1;
              if (*piVar3 == 0) {
                Alloc::~Alloc(pAVar23);
                operator_delete(pAVar23,0x48);
              }
            }
            uVar27 = local_e8._0_8_;
            if ((local_e8._0_8_ & 7) == 0 && (Alloc *)local_e8._0_8_ != (Alloc *)0x0) {
              piVar3 = (int *)(local_e8._0_8_ + 0x30);
              *piVar3 = *piVar3 + -1;
              if (*piVar3 == 0) {
                Alloc::~Alloc((Alloc *)local_e8._0_8_);
                operator_delete((void *)uVar27,0x48);
              }
            }
          }
        }
        iVar29 = 0;
        do {
          pMVar7 = local_f0;
          IVar12 = Omega_h::Mesh::ntags(local_f0,(Int)local_f8);
          poVar17 = local_108;
          if (IVar12 <= iVar29) {
            std::__ostream_insert<char,std::char_traits<char>>(local_108,"</CellData>\n",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</Piece>\n",9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</UnstructuredGrid>\n",0x14)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"</VTKFile>\n",0xb);
            uVar27 = local_a0._0_8_;
            if ((local_a0._0_8_ & 7) == 0 && (Alloc *)local_a0._0_8_ != (Alloc *)0x0) {
              piVar3 = (int *)(local_a0._0_8_ + 0x30);
              *piVar3 = *piVar3 + -1;
              if (*piVar3 == 0) {
                Alloc::~Alloc((Alloc *)local_a0._0_8_);
                operator_delete((void *)uVar27,0x48);
              }
            }
            ScopedTimer::~ScopedTimer(&local_f9);
            return;
          }
          pTVar20 = Omega_h::Mesh::get_tag(pMVar7,(Int)local_f8,iVar29);
          psVar21 = TagBase::name_abi_cxx11_(pTVar20);
          iVar10 = std::__cxx11::string::compare((char *)psVar21);
          if (iVar10 != 0) {
            psVar21 = TagBase::name_abi_cxx11_(pTVar20);
            cVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&psVar26->_M_t,psVar21);
            if ((_Rb_tree_header *)cVar18._M_node != p_Var4) {
              if (3 < (uint)local_f0->dim_) {
                fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                     ,0x33);
              }
              write_tag(local_108,pTVar20,local_f0->dim_,SUB41(local_10c,0));
            }
          }
          iVar29 = iVar29 + 1;
        } while( true );
      }
      pTVar20 = Omega_h::Mesh::get_tag(pMVar7,0,iVar29);
      psVar21 = TagBase::name_abi_cxx11_(pTVar20);
      iVar10 = std::__cxx11::string::compare((char *)psVar21);
      if (iVar10 != 0) {
        psVar21 = TagBase::name_abi_cxx11_(pTVar20);
        iVar10 = std::__cxx11::string::compare((char *)psVar21);
        if (iVar10 != 0) {
          psVar21 = TagBase::name_abi_cxx11_(pTVar20);
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_c8,psVar21);
          if ((_Rb_tree_header *)cVar18._M_node != &(psVar26->_M_t)._M_impl.super__Rb_tree_header) {
            if (3 < (uint)pMVar7->dim_) {
              fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                   ,0x33);
            }
            write_tag(local_108,pTVar20,pMVar7->dim_,SUB41(local_10c,0));
          }
        }
      }
      iVar29 = iVar29 + 1;
    } while( true );
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void write_vtu(std::ostream& stream, Mesh* mesh, Int cell_dim,
    TagSet const& tags, bool compress) {
  OMEGA_H_TIME_FUNCTION;
  default_dim(mesh, &cell_dim);
  verify_vtk_tagset(mesh, cell_dim, tags);
  write_vtkfile_vtu_start_tag(stream, compress);
  stream << "<UnstructuredGrid>\n";
  write_piece_start_tag(stream, mesh, cell_dim);
  stream << "<Cells>\n";
  write_connectivity(stream, mesh, cell_dim, compress);
  stream << "</Cells>\n";
  stream << "<Points>\n";
  auto coords = mesh->coords();
  write_array(stream, "coordinates", 3, resize_vectors(coords, mesh->dim(), 3),
      compress);
  stream << "</Points>\n";
  stream << "<PointData>\n";
  /* globals go first so read_vtu() knows where to find them */
  if (mesh->has_tag(VERT, "global") && tags[VERT].count("global")) {
    write_tag(stream, mesh->get_tag<GO>(VERT, "global"), mesh->dim(), compress);
  }
  write_locals_and_owners(stream, mesh, VERT, tags, compress);
  for (Int i = 0; i < mesh->ntags(VERT); ++i) {
    auto tag = mesh->get_tag(VERT, i);
    if (tag->name() != "coordinates" && tag->name() != "global" &&
        tags[VERT].count(tag->name())) {
      write_tag(stream, tag, mesh->dim(), compress);
    }
  }
  stream << "</PointData>\n";
  stream << "<CellData>\n";
  /* globals go first so read_vtu() knows where to find them */
  if (mesh->has_tag(cell_dim, "global") &&
      tags[size_t(cell_dim)].count("global")) {
    write_tag(
        stream, mesh->get_tag<GO>(cell_dim, "global"), mesh->dim(), compress);
  }
  write_locals_and_owners(stream, mesh, cell_dim, tags, compress);
  if (tags[size_t(cell_dim)].count("vtkGhostType")) {
    write_vtk_ghost_types(stream, mesh, cell_dim, compress);
  }
  for (Int i = 0; i < mesh->ntags(cell_dim); ++i) {
    auto tag = mesh->get_tag(cell_dim, i);
    if (tag->name() != "global" && tags[size_t(cell_dim)].count(tag->name())) {
      write_tag(stream, tag, mesh->dim(), compress);
    }
  }
  stream << "</CellData>\n";
  stream << "</Piece>\n";
  stream << "</UnstructuredGrid>\n";
  stream << "</VTKFile>\n";
}